

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytestring_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_189743::CBSTest_BERElementTest_Test::TestBody(CBSTest_BERElementTest_Test *this)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  uint *rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  char *pcVar5;
  int *in_R9;
  ScopedTrace gtest_trace_810;
  CBS in;
  vector<unsigned_char,_std::allocator<unsigned_char>_> in_bytes;
  int indefinite;
  int ber_found;
  CBS_ASN1_TAG tag;
  CBS out;
  size_t header_len;
  ScopedTrace local_d9;
  undefined1 local_d8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_b0;
  Bytes local_a8;
  undefined1 local_98 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_90;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_88;
  int local_64;
  int local_60;
  CBS_ASN1_TAG local_5c;
  CBS local_58;
  long local_48;
  AssertHelper local_40;
  size_t local_38;
  
  rhs = (uint *)&DAT_006cc5fc;
  local_48 = 0x120;
  do {
    pcVar5 = *(char **)(rhs + -3);
    testing::ScopedTrace::ScopedTrace
              (&local_d9,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
               ,0x32a,pcVar5);
    local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_d8,pcVar5,(allocator<char> *)&local_58);
    bVar2 = DecodeHex(&local_88,(string *)local_d8);
    local_98[0] = bVar2;
    local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_d8._1_7_,local_d8[0]) == &local_c8) {
      if (bVar2) goto LAB_00217627;
LAB_00217b3d:
      testing::Message::Message((Message *)&local_58);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_d8,(internal *)local_98,
                 (AssertionResult *)"DecodeHex(&in_bytes, test.in_hex)","false","true",(char *)in_R9
                );
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_b8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x32d,(char *)CONCAT71(local_d8._1_7_,local_d8[0]));
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_b8,(Message *)&local_58);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_d8._1_7_,local_d8[0]) != &local_c8) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_d8._1_7_,local_d8[0]),local_c8._M_allocated_capacity + 1);
      }
      if ((long *)local_58.data != (long *)0x0) {
        (**(code **)(*(long *)local_58.data + 8))();
      }
      if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_90;
        pbVar4 = local_90;
LAB_00217c81:
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()(this_00,pbVar4);
      }
LAB_00217c86:
      iVar3 = 1;
    }
    else {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_d8._1_7_,local_d8[0]),local_c8._M_allocated_capacity + 1);
      if (((ulong)local_98 & 1) == 0) goto LAB_00217b3d;
LAB_00217627:
      if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_90,local_90);
      }
      local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_finish +
                 -(long)local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      local_98 = (undefined1  [8])
                 local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
      in_R9 = &local_64;
      iVar3 = CBS_get_any_ber_asn1_element
                        ((CBS *)local_98,&local_58,&local_5c,&local_38,&local_60,in_R9);
      pbVar4 = local_b8;
      cVar1 = (char)rhs[-1];
      bVar2 = (bool)cVar1 == (iVar3 == 1);
      local_b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT71(local_b8._1_7_,bVar2);
      pbStack_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (!bVar2) {
        testing::Message::Message((Message *)&local_a8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_d8,(internal *)&local_b8,
                   (AssertionResult *)"(ok == 1) == test.ok","false","true",(char *)in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_40,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                   ,0x336,(char *)CONCAT71(local_d8._1_7_,local_d8[0]));
        testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_a8);
        testing::internal::AssertHelper::~AssertHelper(&local_40);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_d8._1_7_,local_d8[0]) != &local_c8) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(local_d8._1_7_,local_d8[0]),local_c8._M_allocated_capacity + 1
                         );
        }
        if ((long *)local_a8.span_.data_ != (long *)0x0) {
          (**(code **)(*(long *)local_a8.span_.data_ + 8))();
        }
        if (pbStack_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        {
          this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&pbStack_b0;
          pbVar4 = pbStack_b0;
          goto LAB_00217c81;
        }
        goto LAB_00217c86;
      }
      iVar3 = 3;
      if (cVar1 != '\0') {
        local_b8._4_4_ = SUB84(pbVar4,4);
        local_b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(local_b8._4_4_,(uint)*(byte *)((long)rhs + -3));
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_d8,"test.ber_found ? 1 : 0","ber_found",(int *)&local_b8,
                   &local_60);
        if (local_d8[0] == '\0') {
          testing::Message::Message((Message *)&local_b8);
          pcVar5 = "";
          if (local_d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar5 = (local_d0->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_a8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                     ,0x33b,pcVar5);
          testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)&local_b8)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
          if (local_b8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            (**(code **)(*(long *)local_b8 + 8))();
          }
        }
        if (local_d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_d0,local_d0);
        }
        local_b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(local_b8._4_4_,(uint)*(byte *)((long)rhs + -2));
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_d8,"test.indefinite ? 1 : 0","indefinite",(int *)&local_b8,
                   &local_64);
        if (local_d8[0] == '\0') {
          testing::Message::Message((Message *)&local_b8);
          pcVar5 = "";
          if (local_d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar5 = (local_d0->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_a8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                     ,0x33c,pcVar5);
          testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)&local_b8)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
          if (local_b8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            (**(code **)(*(long *)local_b8 + 8))();
          }
        }
        if (local_d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_d0,local_d0);
        }
        local_b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish +
                   -(long)local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        testing::internal::CmpHelperLE<unsigned_long,unsigned_long>
                  ((internal *)local_d8,"header_len","in_bytes.size()",&local_38,
                   (unsigned_long *)&local_b8);
        if (local_d8[0] == '\0') {
          testing::Message::Message((Message *)&local_b8);
          pcVar5 = "";
          if (local_d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar5 = (local_d0->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_a8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                     ,0x33d,pcVar5);
          testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)&local_b8)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
          if (local_b8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            (**(code **)(*(long *)local_b8 + 8))();
          }
        }
        if (local_d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_d0,local_d0);
        }
        local_b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58.len
        ;
        local_a8.span_.data_ =
             local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish +
             -(long)local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                  ((internal *)local_d8,"CBS_len(&out)","in_bytes.size()",(unsigned_long *)&local_b8
                   ,(unsigned_long *)&local_a8);
        if (local_d8[0] == '\0') {
          testing::Message::Message((Message *)&local_b8);
          pcVar5 = "";
          if (local_d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar5 = (local_d0->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_a8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                     ,0x33e,pcVar5);
          testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)&local_b8)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
          if (local_b8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            (**(code **)((local_b8->_M_dataplus)._M_p + 8))();
          }
        }
        if (local_d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_d0,local_d0);
        }
        local_b8 = local_90;
        local_a8.span_.data_ = (uchar *)((ulong)local_a8.span_.data_ & 0xffffffff00000000);
        testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
                  ((internal *)local_d8,"CBS_len(&in)","0u",(unsigned_long *)&local_b8,
                   (uint *)&local_a8);
        if (local_d8[0] == '\0') {
          testing::Message::Message((Message *)&local_b8);
          pcVar5 = "";
          if (local_d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar5 = (local_d0->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_a8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                     ,0x33f,pcVar5);
          testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)&local_b8)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
          if (local_b8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            (**(code **)((local_b8->_M_dataplus)._M_p + 8))();
          }
        }
        if (local_d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_d0,local_d0);
        }
        local_b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_58.data;
        pbStack_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_58.len;
        local_a8.span_.size_ =
             (long)local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        local_a8.span_.data_ =
             local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
        testing::internal::CmpHelperEQ<Bytes,Bytes>
                  ((internal *)local_d8,"Bytes(out)","Bytes(in_bytes)",(Bytes *)&local_b8,&local_a8)
        ;
        if (local_d8[0] == '\0') {
          testing::Message::Message((Message *)&local_b8);
          pcVar5 = "";
          if (local_d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar5 = (local_d0->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_a8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                     ,0x340,pcVar5);
          testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)&local_b8)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
          if (local_b8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            (**(code **)(*(long *)local_b8 + 8))();
          }
        }
        if (local_d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_d0,local_d0);
        }
        testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                  ((internal *)local_d8,"tag","test.tag",&local_5c,rhs);
        if (local_d8[0] == '\0') {
          testing::Message::Message((Message *)&local_b8);
          pcVar5 = "";
          if (local_d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar5 = (local_d0->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_a8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                     ,0x341,pcVar5);
          testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)&local_b8)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
          if (local_b8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            (**(code **)(*(long *)local_b8 + 8))();
          }
        }
        if (local_d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_d0,local_d0);
        }
        iVar3 = 0;
      }
    }
    if ((long *)local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start != (long *)0x0) {
      operator_delete(local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_88.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_88.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    testing::ScopedTrace::~ScopedTrace(&local_d9);
    if ((iVar3 != 3) && (iVar3 != 0)) {
      return;
    }
    rhs = rhs + 4;
    local_48 = local_48 + -0x10;
    if (local_48 == 0) {
      return;
    }
  } while( true );
}

Assistant:

TEST(CBSTest, BERElementTest) {
  for (const auto &test : kBERTests) {
    SCOPED_TRACE(test.in_hex);

    std::vector<uint8_t> in_bytes;
    ASSERT_TRUE(DecodeHex(&in_bytes, test.in_hex));
    CBS in(in_bytes);
    CBS out;
    CBS_ASN1_TAG tag;
    size_t header_len;
    int ber_found;
    int indefinite;
    int ok = CBS_get_any_ber_asn1_element(&in, &out, &tag, &header_len,
                                          &ber_found, &indefinite);
    ASSERT_TRUE((ok == 1) == test.ok);
    if (!test.ok) {
      continue;
    }

    EXPECT_EQ(test.ber_found ? 1 : 0, ber_found);
    EXPECT_EQ(test.indefinite ? 1 : 0, indefinite);
    EXPECT_LE(header_len, in_bytes.size());
    EXPECT_EQ(CBS_len(&out), in_bytes.size());
    EXPECT_EQ(CBS_len(&in), 0u);
    EXPECT_EQ(Bytes(out), Bytes(in_bytes));
    EXPECT_EQ(tag, test.tag);
  }
}